

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource,_2UL>::
         Construct(DB *db,LIST *params)

{
  IfcConstructionMaterialResource *in;
  
  in = (IfcConstructionMaterialResource *)operator_new(0x1d0);
  *(undefined ***)&in->field_0x1b8 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x1c0 = 0;
  *(char **)&in->field_0x1c8 = "IfcConstructionMaterialResource";
  Assimp::IFC::Schema_2x3::IfcConstructionResource::IfcConstructionResource
            ((IfcConstructionResource *)in,&PTR_construction_vtable_24__008a33e8);
  *(undefined8 *)&(in->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined ***)&in->super_IfcConstructionResource =
       &PTR__IfcConstructionMaterialResource_008a32e0;
  *(undefined ***)&in->field_0x1b8 = &PTR__IfcConstructionMaterialResource_008a33d0;
  *(undefined ***)&(in->super_IfcConstructionResource).field_0x88 =
       &PTR__IfcConstructionMaterialResource_008a3308;
  *(undefined ***)&(in->super_IfcConstructionResource).field_0x98 =
       &PTR__IfcConstructionMaterialResource_008a3330;
  *(undefined ***)&(in->super_IfcConstructionResource).field_0xd0 =
       &PTR__IfcConstructionMaterialResource_008a3358;
  (in->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcConstructionMaterialResource_008a3380;
  *(undefined ***)&(in->super_IfcConstructionResource).field_0x178 =
       &PTR__IfcConstructionMaterialResource_008a33a8;
  *(undefined8 *)&(in->super_IfcConstructionResource).field_0x188 = 0;
  *(undefined8 *)&in->field_0x190 = 0;
  *(undefined8 *)&in->field_0x191 = 0;
  *(undefined8 *)&in->field_0x199 = 0;
  (in->UsageRatio).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource>(db,params,in);
  return (Object *)
         (&(in->super_IfcConstructionResource).field_0x0 +
         *(long *)(*(long *)&in->super_IfcConstructionResource + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }